

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O0

bool IsValidDestination(CTxDestination *dest)

{
  long lVar1;
  __visit_result_t<(anonymous_namespace)::ValidDestinationVisitor,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
  _Var2;
  ValidDestinationVisitor *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = std::
          visit<(anonymous_namespace)::ValidDestinationVisitor,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>const&>
                    (in_RDI,(variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsValidDestination(const CTxDestination& dest) {
    return std::visit(ValidDestinationVisitor(), dest);
}